

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagStackFrame.cpp
# Opt level: O0

void __thiscall
Js::DiagInterpreterStackFrame::DiagInterpreterStackFrame
          (DiagInterpreterStackFrame *this,InterpreterStackFrame *frame)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *pSVar4;
  InterpreterStackFrame *frame_local;
  DiagInterpreterStackFrame *this_local;
  
  DiagStackFrame::DiagStackFrame(&this->super_DiagStackFrame);
  (this->super_DiagStackFrame)._vptr_DiagStackFrame =
       (_func_int **)&PTR__DiagInterpreterStackFrame_01ded3e8;
  this->m_interpreterFrame = frame;
  if (this->m_interpreterFrame == (InterpreterStackFrame *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                                ,0x19b,"(m_interpreterFrame != __null)","m_interpreterFrame != NULL"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = InterpreterStackFrame::GetScriptContext(this->m_interpreterFrame);
  if (pSVar4 != (ScriptContext *)0x0) {
    pSVar4 = InterpreterStackFrame::GetScriptContext(this->m_interpreterFrame);
    bVar2 = ScriptContext::IsScriptContextInDebugMode(pSVar4);
    if (bVar2) {
      return;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagStackFrame.cpp"
                              ,0x19d,
                              "(m_interpreterFrame->GetScriptContext() && m_interpreterFrame->GetScriptContext()->IsScriptContextInDebugMode())"
                              ,"This only supports interpreter stack frames running in debug mode.")
  ;
  if (bVar2) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
    return;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

DiagInterpreterStackFrame::DiagInterpreterStackFrame(InterpreterStackFrame* frame) :
        m_interpreterFrame(frame)
    {
        Assert(m_interpreterFrame != NULL);
        AssertMsg(m_interpreterFrame->GetScriptContext() && m_interpreterFrame->GetScriptContext()->IsScriptContextInDebugMode(),
            "This only supports interpreter stack frames running in debug mode.");
    }